

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O0

void WebRtcSpl_VectorBitShiftW16(int16_t *res,size_t length,int16_t *in,int16_t right_shifts)

{
  size_t local_30;
  size_t i;
  int16_t *piStack_20;
  int16_t right_shifts_local;
  int16_t *in_local;
  size_t length_local;
  int16_t *res_local;
  
  local_30 = length;
  piStack_20 = in;
  length_local = (size_t)res;
  if (right_shifts < 1) {
    for (; local_30 != 0; local_30 = local_30 - 1) {
      *(short *)length_local = (short)((int)*piStack_20 << (-(byte)right_shifts & 0x1f));
      piStack_20 = piStack_20 + 1;
      length_local = length_local + 2;
    }
  }
  else {
    for (; local_30 != 0; local_30 = local_30 - 1) {
      *(short *)length_local = (short)((int)*piStack_20 >> ((byte)right_shifts & 0x1f));
      piStack_20 = piStack_20 + 1;
      length_local = length_local + 2;
    }
  }
  return;
}

Assistant:

void WebRtcSpl_VectorBitShiftW16(int16_t *res, size_t length,
                                 const int16_t *in, int16_t right_shifts)
{
    size_t i;

    if (right_shifts > 0)
    {
        for (i = length; i > 0; i--)
        {
            (*res++) = ((*in++) >> right_shifts);
        }
    } else
    {
        for (i = length; i > 0; i--)
        {
            (*res++) = ((*in++) << (-right_shifts));
        }
    }
}